

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O2

int ExUtilReadFileToWebPData(char *filename,WebPData *webp_data)

{
  int iVar1;
  int iVar2;
  size_t size;
  uint8_t *data;
  
  iVar2 = 0;
  if (webp_data != (WebPData *)0x0) {
    iVar1 = ImgIoUtilReadFile(filename,&data,&size);
    if (iVar1 != 0) {
      webp_data->bytes = data;
      webp_data->size = size;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ExUtilReadFileToWebPData(const char* const filename,
                             WebPData* const webp_data) {
  const uint8_t* data;
  size_t size;
  if (webp_data == NULL) return 0;
  if (!ImgIoUtilReadFile(filename, &data, &size)) return 0;
  webp_data->bytes = data;
  webp_data->size = size;
  return 1;
}